

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

Vec_Ptr_t *
Aig_ManRegProjectOnehots(Aig_Man_t *pAig,Aig_Man_t *pPart,Vec_Ptr_t *vOnehots,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  Vec_Int_t *p;
  int *piVar7;
  void **ppvVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  
  pVVar10 = pPart->vCis;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      *(int *)((long)pVVar10->pArray[lVar11] + 0x28) = (int)lVar11;
      lVar11 = lVar11 + 1;
      pVVar10 = pPart->vCis;
    } while (lVar11 < pVVar10->nSize);
  }
  if (vOnehots->nSize < 1) {
    pVVar9 = (Vec_Ptr_t *)0x0;
  }
  else {
    iVar1 = pAig->nObjs[2];
    iVar2 = pAig->nRegs;
    lVar11 = 0;
    pVVar9 = (Vec_Ptr_t *)0x0;
    do {
      pvVar4 = vOnehots->pArray[lVar11];
      uVar12 = *(uint *)((long)pvVar4 + 4);
      if (0 < (int)uVar12) {
        lVar13 = 0;
        p = (Vec_Int_t *)0x0;
        do {
          uVar6 = *(int *)(*(long *)((long)pvVar4 + 8) + lVar13 * 4) + (iVar1 - iVar2);
          if (((int)uVar6 < 0) || (pAig->vCis->nSize <= (int)uVar6)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar5 = pAig->vCis->pArray[uVar6];
          if (*(int *)((long)pvVar5 + 0x20) == pAig->nTravIds) {
            if (p == (Vec_Int_t *)0x0) {
              p = (Vec_Int_t *)malloc(0x10);
              if (uVar12 - 1 < 0xf) {
                uVar12 = 0x10;
              }
              p->nSize = 0;
              p->nCap = uVar12;
              piVar7 = (int *)malloc((ulong)uVar12 << 2);
              p->pArray = piVar7;
            }
            Vec_IntPush(p,*(int *)(*(long *)((long)pvVar5 + 0x28) + 0x28));
            uVar12 = *(uint *)((long)pvVar4 + 4);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < (int)uVar12);
        if (p != (Vec_Int_t *)0x0) {
          if (p->nSize < 2) {
            if (p->pArray != (int *)0x0) {
              free(p->pArray);
            }
            free(p);
          }
          else {
            if (pVVar9 == (Vec_Ptr_t *)0x0) {
              pVVar9 = (Vec_Ptr_t *)malloc(0x10);
              pVVar9->nCap = 100;
              pVVar9->nSize = 0;
              ppvVar8 = (void **)malloc(800);
              pVVar9->pArray = ppvVar8;
LAB_006c9cf9:
              ppvVar8 = pVVar9->pArray;
            }
            else {
              uVar12 = pVVar9->nCap;
              if (pVVar9->nSize != uVar12) goto LAB_006c9cf9;
              if ((int)uVar12 < 0x10) {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc(0x80);
                }
                else {
                  ppvVar8 = (void **)realloc(pVVar9->pArray,0x80);
                }
                pVVar9->pArray = ppvVar8;
                pVVar9->nCap = 0x10;
              }
              else {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar8 = (void **)malloc((ulong)uVar12 << 4);
                }
                else {
                  ppvVar8 = (void **)realloc(pVVar9->pArray,(ulong)uVar12 << 4);
                }
                pVVar9->pArray = ppvVar8;
                pVVar9->nCap = uVar12 * 2;
              }
            }
            iVar3 = pVVar9->nSize;
            pVVar9->nSize = iVar3 + 1;
            ppvVar8[iVar3] = p;
          }
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < vOnehots->nSize);
    pVVar10 = pPart->vCis;
  }
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      *(undefined4 *)((long)pVVar10->pArray[lVar11] + 0x28) = 0;
      lVar11 = lVar11 + 1;
      pVVar10 = pPart->vCis;
    } while (lVar11 < pVVar10->nSize);
  }
  if ((fVerbose != 0) && (pVVar9 != (Vec_Ptr_t *)0x0)) {
    printf("Partition contains %d groups of 1-hot registers: { ",(ulong)(uint)pVVar9->nSize);
    if (0 < pVVar9->nSize) {
      lVar11 = 0;
      do {
        printf("%d ",(ulong)*(uint *)((long)pVVar9->pArray[lVar11] + 4));
        lVar11 = lVar11 + 1;
      } while (lVar11 < pVVar9->nSize);
    }
    puts("}");
  }
  return pVVar9;
}

Assistant:

Vec_Ptr_t * Aig_ManRegProjectOnehots( Aig_Man_t * pAig, Aig_Man_t * pPart, Vec_Ptr_t * vOnehots, int fVerbose )
{
    Vec_Ptr_t * vOnehotsPart = NULL;
    Vec_Int_t * vGroup, * vGroupNew;
    Aig_Obj_t * pObj, * pObjNew;
    int nOffset, iReg, i, k;
    // set the PI numbers
    Aig_ManForEachCi( pPart, pObj, i )
        pObj->iData = i;
    // go through each group and check if registers are involved in this one
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vGroup, i )
    {
        vGroupNew = NULL;
        Vec_IntForEachEntry( vGroup, iReg, k )
        {
            pObj = Aig_ManCi( pAig, nOffset+iReg );
            if ( !Aig_ObjIsTravIdCurrent(pAig, pObj) )
                continue;
            if ( vGroupNew == NULL )
                vGroupNew = Vec_IntAlloc( Vec_IntSize(vGroup) );
            pObjNew = (Aig_Obj_t *)pObj->pData;
            Vec_IntPush( vGroupNew, pObjNew->iData );
        }
        if ( vGroupNew == NULL )
            continue;
        if ( Vec_IntSize(vGroupNew) > 1 )
        {
            if ( vOnehotsPart == NULL )
                vOnehotsPart = Vec_PtrAlloc( 100 );
            Vec_PtrPush( vOnehotsPart, vGroupNew );
        }
        else
            Vec_IntFree( vGroupNew );
    }
    // clear the PI numbers
    Aig_ManForEachCi( pPart, pObj, i )
        pObj->iData = 0;
    // print out
    if ( vOnehotsPart && fVerbose )
    {
        printf( "Partition contains %d groups of 1-hot registers: { ", Vec_PtrSize(vOnehotsPart) );
        Vec_PtrForEachEntry( Vec_Int_t *, vOnehotsPart, vGroup, k )
            printf( "%d ", Vec_IntSize(vGroup) );
        printf( "}\n" );
    }
    return vOnehotsPart;
}